

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::output_three_particle_correlation_rap(singleParticleSpectra *this)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ofstream output2;
  ofstream output1;
  ofstream output_ss2;
  ofstream output_os1;
  ofstream output_ss1;
  ofstream output_os2;
  ostringstream filename_os2;
  ostringstream filename_os1;
  ostringstream filename_ss2;
  ostringstream filename_ss1;
  ostringstream filename2;
  ostringstream filename1;
  double local_1550;
  double local_1548;
  double local_1540;
  double local_1538;
  double local_1528;
  char *local_1520;
  char local_1510 [16];
  char *local_1500;
  filebuf local_14f8 [8];
  char local_14f0 [8];
  uint auStack_14e8 [56];
  ios_base aiStack_1408 [264];
  char *local_1300;
  filebuf local_12f8 [8];
  undefined8 uStack_12f0;
  uint auStack_12e8 [56];
  ios_base aiStack_1208 [264];
  char *local_1100;
  filebuf local_10f8 [8];
  char local_10f0 [8];
  uint auStack_10e8 [56];
  ios_base aiStack_1008 [264];
  char *local_f00;
  filebuf local_ef8 [8];
  char local_ef0 [8];
  uint auStack_ee8 [56];
  ios_base aiStack_e08 [264];
  char *local_d00;
  filebuf local_cf8 [8];
  char local_cf0 [8];
  uint auStack_ce8 [56];
  ios_base aiStack_c08 [264];
  char *local_b00;
  filebuf local_af8 [8];
  char local_af0 [8];
  uint auStack_ae8 [56];
  ios_base aiStack_a08 [264];
  ostringstream local_900 [112];
  ios_base local_890 [264];
  ostringstream local_788 [112];
  ios_base local_718 [264];
  ostringstream local_610 [112];
  ios_base local_5a0 [264];
  ostringstream local_498 [112];
  ios_base local_428 [264];
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__cxx11::ostringstream::ostringstream(local_320);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_Cmnk_eta12",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_pT_",4);
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_320,(this->path_)._M_dataplus._M_p,
                      (this->path_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_Cmnk_eta13",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_pT_",4);
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_1300,local_1500,_S_out);
  if (local_1500 != local_14f0) {
    operator_delete(local_1500);
  }
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&local_1500,local_d00,_S_out);
  if (local_d00 != local_cf0) {
    operator_delete(local_d00);
  }
  if (this->rap_type == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1300,"# eta12  C_nmk  C_nmk_err ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1300,"(000, 112, 123, 224, 235, 134, 246, 336, 347)",0x2d);
    std::ios::widen((char)*(undefined8 *)(local_1300 + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    lVar2 = 0x1a;
    pcVar3 = "# eta13  C_nmk  C_nmk_err ";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1300,"# y12  C_nmk  C_nmk_err ",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1300,"(000, 112, 123, 224, 235, 134, 246, 336, 347)",0x2d);
    std::ios::widen((char)*(undefined8 *)(local_1300 + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    lVar2 = 0x18;
    pcVar3 = "# y13  C_nmk  C_nmk_err ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1500,pcVar3,lVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1500,"(000, 112, 123, 224, 235, 134, 246, 336, 347)",0x2d);
  std::ios::widen((char)*(undefined8 *)(local_1500 + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  if (0 < this->N_rap) {
    lVar2 = 0;
    do {
      dVar13 = (double)(int)lVar2 * this->drap + this->rapidity_dis_min;
      dVar8 = (double)this->total_number_of_events;
      dVar9 = *(double *)
               (*(long *)&(((this->C_nmk_eta12).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar2 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->C_nmk_eta12_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar2 * 8) / dVar8 - dVar9 * dVar9;
      local_1550 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_1550 = sqrt(dVar7);
        }
        else {
          local_1550 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_12e8 + *(long *)(local_1300 + -0x18)) =
           *(uint *)((long)auStack_12e8 + *(long *)(local_1300 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)&uStack_12f0 + *(long *)(local_1300 + -0x18)) = 0x12;
      *(undefined8 *)(local_12f8 + *(long *)(local_1300 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(dVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(local_1550);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      dVar8 = (double)this->total_number_of_events;
      dVar10 = *(double *)
                (*(long *)&(((this->C_nmk_eta13).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar2 * 8) / dVar8;
      dVar7 = *(double *)
               (*(long *)&(((this->C_nmk_eta13_err).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data + lVar2 * 8) / dVar8 - dVar10 * dVar10;
      local_1550 = 0.0;
      if (0.0 < dVar7) {
        dVar7 = dVar7 / dVar8;
        if (dVar7 < 0.0) {
          local_1550 = sqrt(dVar7);
        }
        else {
          local_1550 = SQRT(dVar7);
        }
      }
      *(uint *)((long)auStack_14e8 + *(long *)(local_1500 + -0x18)) =
           *(uint *)((long)auStack_14e8 + *(long *)(local_1500 + -0x18)) & 0xfffffefb | 0x100;
      pcVar3 = local_14f0 + *(long *)(local_1500 + -0x18);
      pcVar3[0] = '\x12';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      *(undefined8 *)(local_14f8 + *(long *)(local_1500 + -0x18)) = 8;
      poVar1 = std::ostream::_M_insert<double>(dVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(dVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      poVar1 = std::ostream::_M_insert<double>(local_1550);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      if (1 < this->num_corr) {
        lVar5 = 1;
        lVar4 = 0x18;
        do {
          dVar8 = (double)this->total_number_of_events;
          dVar13 = *(double *)
                    (*(long *)((long)&(((this->C_nmk_eta12).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8;
          dVar7 = *(double *)
                   (*(long *)((long)&(((this->C_nmk_eta12_err).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8 -
                  dVar13 * dVar13;
          local_1550 = 0.0;
          if (0.0 < dVar7) {
            dVar7 = dVar7 / dVar8;
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_1550 = dVar7 / dVar9;
          }
          *(uint *)((long)auStack_12e8 + *(long *)(local_1300 + -0x18)) =
               *(uint *)((long)auStack_12e8 + *(long *)(local_1300 + -0x18)) & 0xfffffefb | 0x100;
          *(undefined8 *)((long)&uStack_12f0 + *(long *)(local_1300 + -0x18)) = 0x12;
          *(undefined8 *)(local_12f8 + *(long *)(local_1300 + -0x18)) = 8;
          poVar1 = std::ostream::_M_insert<double>(dVar13 / dVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          poVar1 = std::ostream::_M_insert<double>(local_1550);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          dVar8 = (double)this->total_number_of_events;
          dVar13 = *(double *)
                    (*(long *)((long)&(((this->C_nmk_eta13).
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8;
          dVar7 = *(double *)
                   (*(long *)((long)&(((this->C_nmk_eta13_err).
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                     super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8 -
                  dVar13 * dVar13;
          local_1550 = 0.0;
          if (0.0 < dVar7) {
            dVar7 = dVar7 / dVar8;
            if (dVar7 < 0.0) {
              dVar7 = sqrt(dVar7);
            }
            else {
              dVar7 = SQRT(dVar7);
            }
            local_1550 = dVar7 / dVar10;
          }
          *(uint *)((long)auStack_14e8 + *(long *)(local_1500 + -0x18)) =
               *(uint *)((long)auStack_14e8 + *(long *)(local_1500 + -0x18)) & 0xfffffefb | 0x100;
          pcVar3 = local_14f0 + *(long *)(local_1500 + -0x18);
          pcVar3[0] = '\x12';
          pcVar3[1] = '\0';
          pcVar3[2] = '\0';
          pcVar3[3] = '\0';
          pcVar3[4] = '\0';
          pcVar3[5] = '\0';
          pcVar3[6] = '\0';
          pcVar3[7] = '\0';
          *(undefined8 *)(local_14f8 + *(long *)(local_1500 + -0x18)) = 8;
          poVar1 = std::ostream::_M_insert<double>(dVar13 / dVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          poVar1 = std::ostream::_M_insert<double>(local_1550);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x18;
        } while (lVar5 < this->num_corr);
      }
      std::ios::widen((char)*(undefined8 *)(local_1300 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(local_1500 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->N_rap);
  }
  std::ofstream::close();
  std::ofstream::close();
  local_1300 = _VTT;
  uVar6 = _log;
  if (this->flag_charge_dependence == 1) {
    std::__cxx11::ostringstream::ostringstream(local_498);
    std::__cxx11::ostringstream::ostringstream(local_610);
    std::__cxx11::ostringstream::ostringstream(local_788);
    std::__cxx11::ostringstream::ostringstream(local_900);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_498,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_Cmnk_eta12_ss_pT_",0x12);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_788,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_Cmnk_eta12_os_pT_",0x12);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_610,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_Cmnk_eta13_ss_pT_",0x12);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_900,(this->path_)._M_dataplus._M_p,
                        (this->path_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/particle_",10);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->particle_monval);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_Cmnk_eta13_os_pT_",0x12);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_min);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
    poVar1 = std::ostream::_M_insert<double>(this->vn_rapidity_dis_pT_max);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".dat",4);
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_d00,local_f00,_S_out);
    if (local_f00 != local_ef0) {
      operator_delete(local_f00);
    }
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_f00,local_1100,_S_out);
    if (local_1100 != local_10f0) {
      operator_delete(local_1100);
    }
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_1100,local_b00,_S_out);
    if (local_b00 != local_af0) {
      operator_delete(local_b00);
    }
    std::__cxx11::stringbuf::str();
    std::ofstream::ofstream(&local_b00,local_1520,_S_out);
    if (local_1520 != local_1510) {
      operator_delete(local_1520);
    }
    if (this->rap_type == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_d00,"# eta12  C_nmk_ss  C_nmk_ss_err",0x1f);
      std::ios::widen((char)*(undefined8 *)(local_d00 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_f00,"# eta12  C_nmk_os  C_nmk_os_err",0x1f);
      std::ios::widen((char)*(undefined8 *)(local_f00 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1100,"# eta13  C_nmk_ss  C_nmk_ss_err",0x1f);
      std::ios::widen((char)*(undefined8 *)(local_1100 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      lVar2 = 0x1f;
      pcVar3 = "# eta13  C_nmk_os  C_nmk_os_err";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_d00,"# y12  C_nmk_ss  C_nmk_ss_err",0x1d);
      std::ios::widen((char)*(undefined8 *)(local_d00 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_f00,"# y12  C_nmk_os  C_nmk_os_err",0x1d);
      std::ios::widen((char)*(undefined8 *)(local_f00 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1100,"# y13  C_nmk_ss  C_nmk_ss_err",0x1d);
      std::ios::widen((char)*(undefined8 *)(local_1100 + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      lVar2 = 0x1d;
      pcVar3 = "# y13  C_nmk_os  C_nmk_os_err";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_b00,pcVar3,lVar2);
    std::ios::widen((char)*(undefined8 *)(local_b00 + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    if (0 < this->N_rap) {
      lVar2 = 0;
      do {
        dVar7 = (double)(int)lVar2 * this->drap + this->rapidity_dis_min;
        dVar9 = (double)this->total_number_of_events;
        dVar13 = *(double *)
                  (*(long *)&(((this->C_nmk_eta12_ss).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar2 * 8) / dVar9;
        dVar8 = *(double *)
                 (*(long *)&(((this->C_nmk_eta12_ss_err).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar2 * 8) / dVar9 - dVar13 * dVar13;
        local_1540 = 0.0;
        if (0.0 < dVar8) {
          dVar8 = dVar8 / dVar9;
          if (dVar8 < 0.0) {
            local_1540 = sqrt(dVar8);
          }
          else {
            local_1540 = SQRT(dVar8);
          }
        }
        *(uint *)((long)auStack_ce8 + *(long *)(local_d00 + -0x18)) =
             *(uint *)((long)auStack_ce8 + *(long *)(local_d00 + -0x18)) & 0xfffffefb | 0x100;
        pcVar3 = local_cf0 + *(long *)(local_d00 + -0x18);
        pcVar3[0] = '\x12';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)(local_cf8 + *(long *)(local_d00 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(local_1540);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        dVar9 = (double)this->total_number_of_events;
        dVar10 = *(double *)
                  (*(long *)&(((this->C_nmk_eta12_os).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar2 * 8) / dVar9;
        dVar8 = *(double *)
                 (*(long *)&(((this->C_nmk_eta12_os_err).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar2 * 8) / dVar9 - dVar10 * dVar10;
        local_1548 = 0.0;
        if (0.0 < dVar8) {
          dVar8 = dVar8 / dVar9;
          if (dVar8 < 0.0) {
            local_1548 = sqrt(dVar8);
          }
          else {
            local_1548 = SQRT(dVar8);
          }
        }
        *(uint *)((long)auStack_ee8 + *(long *)(local_f00 + -0x18)) =
             *(uint *)((long)auStack_ee8 + *(long *)(local_f00 + -0x18)) & 0xfffffefb | 0x100;
        pcVar3 = local_ef0 + *(long *)(local_f00 + -0x18);
        pcVar3[0] = '\x12';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)(local_ef8 + *(long *)(local_f00 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(local_1548);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        dVar9 = (double)this->total_number_of_events;
        dVar11 = *(double *)
                  (*(long *)&(((this->C_nmk_eta13_ss).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar2 * 8) / dVar9;
        dVar8 = *(double *)
                 (*(long *)&(((this->C_nmk_eta13_ss_err).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar2 * 8) / dVar9 - dVar11 * dVar11;
        local_1538 = 0.0;
        if (0.0 < dVar8) {
          dVar8 = dVar8 / dVar9;
          if (dVar8 < 0.0) {
            local_1538 = sqrt(dVar8);
          }
          else {
            local_1538 = SQRT(dVar8);
          }
        }
        *(uint *)((long)auStack_10e8 + *(long *)(local_1100 + -0x18)) =
             *(uint *)((long)auStack_10e8 + *(long *)(local_1100 + -0x18)) & 0xfffffefb | 0x100;
        pcVar3 = local_10f0 + *(long *)(local_1100 + -0x18);
        pcVar3[0] = '\x12';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)(local_10f8 + *(long *)(local_1100 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(local_1538);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        dVar9 = (double)this->total_number_of_events;
        dVar12 = *(double *)
                  (*(long *)&(((this->C_nmk_eta13_os).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar2 * 8) / dVar9;
        dVar8 = *(double *)
                 (*(long *)&(((this->C_nmk_eta13_os_err).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data + lVar2 * 8) / dVar9 - dVar12 * dVar12;
        local_1528 = 0.0;
        if (0.0 < dVar8) {
          dVar8 = dVar8 / dVar9;
          if (dVar8 < 0.0) {
            local_1528 = sqrt(dVar8);
          }
          else {
            local_1528 = SQRT(dVar8);
          }
        }
        *(uint *)((long)auStack_ae8 + *(long *)(local_b00 + -0x18)) =
             *(uint *)((long)auStack_ae8 + *(long *)(local_b00 + -0x18)) & 0xfffffefb | 0x100;
        pcVar3 = local_af0 + *(long *)(local_b00 + -0x18);
        pcVar3[0] = '\x12';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar3[4] = '\0';
        pcVar3[5] = '\0';
        pcVar3[6] = '\0';
        pcVar3[7] = '\0';
        *(undefined8 *)(local_af8 + *(long *)(local_b00 + -0x18)) = 8;
        poVar1 = std::ostream::_M_insert<double>(dVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(dVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        poVar1 = std::ostream::_M_insert<double>(local_1528);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
        if (1 < this->num_corr) {
          lVar5 = 1;
          lVar4 = 0x18;
          do {
            dVar8 = (double)this->total_number_of_events;
            dVar9 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta12_ss).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8;
            dVar7 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta12_ss_err).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8 -
                    dVar9 * dVar9;
            local_1550 = 0.0;
            if (0.0 < dVar7) {
              dVar7 = dVar7 / dVar8;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              local_1550 = dVar7 / dVar13;
            }
            *(uint *)((long)auStack_ce8 + *(long *)(local_d00 + -0x18)) =
                 *(uint *)((long)auStack_ce8 + *(long *)(local_d00 + -0x18)) & 0xfffffefb | 0x100;
            pcVar3 = local_cf0 + *(long *)(local_d00 + -0x18);
            pcVar3[0] = '\x12';
            pcVar3[1] = '\0';
            pcVar3[2] = '\0';
            pcVar3[3] = '\0';
            pcVar3[4] = '\0';
            pcVar3[5] = '\0';
            pcVar3[6] = '\0';
            pcVar3[7] = '\0';
            *(undefined8 *)(local_cf8 + *(long *)(local_d00 + -0x18)) = 8;
            poVar1 = std::ostream::_M_insert<double>(dVar9 / dVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(local_1550);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            dVar8 = (double)this->total_number_of_events;
            dVar9 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta12_os).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8;
            dVar7 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta12_os_err).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8 -
                    dVar9 * dVar9;
            local_1550 = 0.0;
            if (0.0 < dVar7) {
              dVar7 = dVar7 / dVar8;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              local_1550 = dVar7 / dVar10;
            }
            *(uint *)((long)auStack_ee8 + *(long *)(local_f00 + -0x18)) =
                 *(uint *)((long)auStack_ee8 + *(long *)(local_f00 + -0x18)) & 0xfffffefb | 0x100;
            pcVar3 = local_ef0 + *(long *)(local_f00 + -0x18);
            pcVar3[0] = '\x12';
            pcVar3[1] = '\0';
            pcVar3[2] = '\0';
            pcVar3[3] = '\0';
            pcVar3[4] = '\0';
            pcVar3[5] = '\0';
            pcVar3[6] = '\0';
            pcVar3[7] = '\0';
            *(undefined8 *)(local_ef8 + *(long *)(local_f00 + -0x18)) = 8;
            poVar1 = std::ostream::_M_insert<double>(dVar9 / dVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(local_1550);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            dVar8 = (double)this->total_number_of_events;
            dVar9 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta13_ss).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8;
            dVar7 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta13_ss_err).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8 -
                    dVar9 * dVar9;
            local_1550 = 0.0;
            if (0.0 < dVar7) {
              dVar7 = dVar7 / dVar8;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              local_1550 = dVar7 / dVar11;
            }
            *(uint *)((long)auStack_10e8 + *(long *)(local_1100 + -0x18)) =
                 *(uint *)((long)auStack_10e8 + *(long *)(local_1100 + -0x18)) & 0xfffffefb | 0x100;
            pcVar3 = local_10f0 + *(long *)(local_1100 + -0x18);
            pcVar3[0] = '\x12';
            pcVar3[1] = '\0';
            pcVar3[2] = '\0';
            pcVar3[3] = '\0';
            pcVar3[4] = '\0';
            pcVar3[5] = '\0';
            pcVar3[6] = '\0';
            pcVar3[7] = '\0';
            *(undefined8 *)(local_10f8 + *(long *)(local_1100 + -0x18)) = 8;
            poVar1 = std::ostream::_M_insert<double>(dVar9 / dVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(local_1550);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            dVar8 = (double)this->total_number_of_events;
            dVar9 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta13_os).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8;
            dVar7 = *(double *)
                     (*(long *)((long)&(((this->C_nmk_eta13_os_err).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data + lVar4) + lVar2 * 8) / dVar8 -
                    dVar9 * dVar9;
            local_1550 = 0.0;
            if (0.0 < dVar7) {
              dVar7 = dVar7 / dVar8;
              if (dVar7 < 0.0) {
                dVar7 = sqrt(dVar7);
              }
              else {
                dVar7 = SQRT(dVar7);
              }
              local_1550 = dVar7 / dVar12;
            }
            *(uint *)((long)auStack_ae8 + *(long *)(local_b00 + -0x18)) =
                 *(uint *)((long)auStack_ae8 + *(long *)(local_b00 + -0x18)) & 0xfffffefb | 0x100;
            pcVar3 = local_af0 + *(long *)(local_b00 + -0x18);
            pcVar3[0] = '\x12';
            pcVar3[1] = '\0';
            pcVar3[2] = '\0';
            pcVar3[3] = '\0';
            pcVar3[4] = '\0';
            pcVar3[5] = '\0';
            pcVar3[6] = '\0';
            pcVar3[7] = '\0';
            *(undefined8 *)(local_af8 + *(long *)(local_b00 + -0x18)) = 8;
            poVar1 = std::ostream::_M_insert<double>(dVar9 / dVar12);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            poVar1 = std::ostream::_M_insert<double>(local_1550);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 0x18;
          } while (lVar5 < this->num_corr);
        }
        std::ios::widen((char)*(undefined8 *)(local_d00 + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_f00 + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_1100 + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(local_b00 + -0x18));
        std::ostream::put('\0');
        std::ostream::flush();
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->N_rap);
    }
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    std::ofstream::close();
    uVar6 = _log;
    pcVar3 = _VTT;
    local_b00 = _VTT;
    *(undefined8 *)(local_af8 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_af8);
    std::ios_base::~ios_base(aiStack_a08);
    local_1100 = pcVar3;
    *(undefined8 *)(local_10f8 + *(long *)(pcVar3 + -0x18) + -8) = uVar6;
    std::filebuf::~filebuf(local_10f8);
    std::ios_base::~ios_base(aiStack_1008);
    local_f00 = pcVar3;
    *(undefined8 *)(local_ef8 + *(long *)(pcVar3 + -0x18) + -8) = uVar6;
    std::filebuf::~filebuf(local_ef8);
    std::ios_base::~ios_base(aiStack_e08);
    local_d00 = pcVar3;
    *(undefined8 *)(local_cf8 + *(long *)(pcVar3 + -0x18) + -8) = uVar6;
    std::filebuf::~filebuf(local_cf8);
    std::ios_base::~ios_base(aiStack_c08);
    std::__cxx11::ostringstream::~ostringstream(local_900);
    std::ios_base::~ios_base(local_890);
    std::__cxx11::ostringstream::~ostringstream(local_788);
    std::ios_base::~ios_base(local_718);
    std::__cxx11::ostringstream::~ostringstream(local_610);
    std::ios_base::~ios_base(local_5a0);
    std::__cxx11::ostringstream::~ostringstream(local_498);
    std::ios_base::~ios_base(local_428);
    local_1300 = pcVar3;
  }
  local_1500 = local_1300;
  *(undefined8 *)(local_14f8 + *(long *)(local_1300 + -0x18) + -8) = uVar6;
  std::filebuf::~filebuf(local_14f8);
  std::ios_base::~ios_base(aiStack_1408);
  *(undefined8 *)(local_12f8 + *(long *)(local_1300 + -0x18) + -8) = uVar6;
  std::filebuf::~filebuf(local_12f8);
  std::ios_base::~ios_base(aiStack_1208);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void singleParticleSpectra::output_three_particle_correlation_rap() {
    ostringstream filename1, filename2;
    filename1 << path_ << "/particle_" << particle_monval << "_Cmnk_eta12"
              << "_pT_" << vn_rapidity_dis_pT_min << "_"
              << vn_rapidity_dis_pT_max << ".dat";
    filename2 << path_ << "/particle_" << particle_monval << "_Cmnk_eta13"
              << "_pT_" << vn_rapidity_dis_pT_min << "_"
              << vn_rapidity_dis_pT_max << ".dat";
    ofstream output1(filename1.str().c_str());
    ofstream output2(filename2.str().c_str());
    if (rap_type == 0) {
        output1 << "# eta12  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
        output2 << "# eta13  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
    } else {
        output1 << "# y12  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
        output2 << "# y13  C_nmk  C_nmk_err "
                << "(000, 112, 123, 224, 235, 134, 246, 336, 347)" << endl;
    }

    for (int j = 0; j < N_rap; j++) {
        double eta_local = rapidity_dis_min + j * drap;
        double num_pair = C_nmk_eta12[0][j] / total_number_of_events;
        double num_pair_stdsq =
            (C_nmk_eta12_err[0][j] / total_number_of_events
             - num_pair * num_pair);
        double num_pair_err = 0.0;
        if (num_pair_stdsq > 0) {
            num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
        }
        output1 << scientific << setw(18) << setprecision(8) << eta_local
                << "  " << num_pair << "  " << num_pair_err << "  ";
        double num_pair_2 = C_nmk_eta13[0][j] / total_number_of_events;
        double num_pair_2_stdsq =
            (C_nmk_eta13_err[0][j] / total_number_of_events
             - num_pair_2 * num_pair_2);
        num_pair_err = 0.0;
        if (num_pair_2_stdsq > 0) {
            num_pair_err = sqrt(num_pair_2_stdsq / total_number_of_events);
        }
        output2 << scientific << setw(18) << setprecision(8) << eta_local
                << "  " << num_pair_2 << "  " << num_pair_err << "  ";
        for (int i = 1; i < num_corr; i++) {
            double Cnmk_avg = C_nmk_eta12[i][j] / total_number_of_events;
            double Cnmk_stdsq =
                (C_nmk_eta12_err[i][j] / total_number_of_events
                 - Cnmk_avg * Cnmk_avg);
            Cnmk_avg = Cnmk_avg / num_pair;
            double Cnmk_err = 0.0;
            if (Cnmk_stdsq > 0) {
                Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
                Cnmk_err = Cnmk_err / num_pair;
            }
            output1 << scientific << setw(18) << setprecision(8) << Cnmk_avg
                    << "  " << Cnmk_err << "  ";
            Cnmk_avg = C_nmk_eta13[i][j] / total_number_of_events;
            Cnmk_stdsq =
                (C_nmk_eta13_err[i][j] / total_number_of_events
                 - Cnmk_avg * Cnmk_avg);
            Cnmk_avg = Cnmk_avg / num_pair_2;
            Cnmk_err = 0.0;
            if (Cnmk_stdsq > 0) {
                Cnmk_err = sqrt(Cnmk_stdsq / total_number_of_events);
                Cnmk_err = Cnmk_err / num_pair_2;
            }
            Cnmk_stdsq = Cnmk_stdsq / num_pair;
            output2 << scientific << setw(18) << setprecision(8) << Cnmk_avg
                    << "  " << Cnmk_err << "  ";
        }
        output1 << endl;
        output2 << endl;
    }
    output1.close();
    output2.close();
    if (flag_charge_dependence == 1) {
        ostringstream filename_ss1, filename_ss2;
        ostringstream filename_os1, filename_os2;
        filename_ss1 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta12_ss_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_os1 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta12_os_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_ss2 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta13_ss_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        filename_os2 << path_ << "/particle_" << particle_monval
                     << "_Cmnk_eta13_os_pT_" << vn_rapidity_dis_pT_min << "_"
                     << vn_rapidity_dis_pT_max << ".dat";
        ofstream output_ss1(filename_ss1.str().c_str());
        ofstream output_os1(filename_os1.str().c_str());
        ofstream output_ss2(filename_ss2.str().c_str());
        ofstream output_os2(filename_os2.str().c_str());
        if (rap_type == 0) {
            output_ss1 << "# eta12  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os1 << "# eta12  C_nmk_os  C_nmk_os_err" << endl;
            output_ss2 << "# eta13  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os2 << "# eta13  C_nmk_os  C_nmk_os_err" << endl;
        } else {
            output_ss1 << "# y12  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os1 << "# y12  C_nmk_os  C_nmk_os_err" << endl;
            output_ss2 << "# y13  C_nmk_ss  C_nmk_ss_err" << endl;
            output_os2 << "# y13  C_nmk_os  C_nmk_os_err" << endl;
        }

        for (int j = 0; j < N_rap; j++) {
            double eta_local = rapidity_dis_min + j * drap;
            double num_pair_ss = C_nmk_eta12_ss[0][j] / total_number_of_events;
            double num_pair_ss_stdsq =
                (C_nmk_eta12_ss_err[0][j] / total_number_of_events
                 - num_pair_ss * num_pair_ss);
            double num_pair_ss_err = 0.0;
            if (num_pair_ss_stdsq > 0) {
                num_pair_ss_err =
                    (sqrt(num_pair_ss_stdsq / total_number_of_events));
            }
            output_ss1 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_ss << "  " << num_pair_ss_err
                       << "  ";
            double num_pair_os = C_nmk_eta12_os[0][j] / total_number_of_events;
            double num_pair_os_stdsq =
                (C_nmk_eta12_os_err[0][j] / total_number_of_events
                 - num_pair_os * num_pair_os);
            double num_pair_os_err = 0.0;
            if (num_pair_os_stdsq > 0) {
                num_pair_os_err =
                    (sqrt(num_pair_os_stdsq / total_number_of_events));
            }
            output_os1 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_os << "  " << num_pair_os_err
                       << "  ";
            double num_pair_ss2 = C_nmk_eta13_ss[0][j] / total_number_of_events;
            double num_pair_ss2_stdsq =
                (C_nmk_eta13_ss_err[0][j] / total_number_of_events
                 - num_pair_ss2 * num_pair_ss2);
            double num_pair_ss2_err = 0.0;
            if (num_pair_ss2_stdsq > 0) {
                num_pair_ss2_err =
                    (sqrt(num_pair_ss2_stdsq / total_number_of_events));
            }
            output_ss2 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_ss2 << "  " << num_pair_ss2_err
                       << "  ";
            double num_pair_os2 = C_nmk_eta13_os[0][j] / total_number_of_events;
            double num_pair_os2_stdsq =
                (C_nmk_eta13_os_err[0][j] / total_number_of_events
                 - num_pair_os2 * num_pair_os2);
            double num_pair_os2_err = 0.0;
            if (num_pair_os2_stdsq > 0) {
                num_pair_os2_err =
                    (sqrt(num_pair_os2_stdsq / total_number_of_events));
            }
            output_os2 << scientific << setw(18) << setprecision(8) << eta_local
                       << "  " << num_pair_os2 << "  " << num_pair_os2_err
                       << "  ";
            for (int i = 1; i < num_corr; i++) {
                double Cnmk_ss_avg =
                    (C_nmk_eta12_ss[i][j] / total_number_of_events);
                double Cnmk_ss_stdsq =
                    (C_nmk_eta12_ss_err[i][j] / total_number_of_events
                     - Cnmk_ss_avg * Cnmk_ss_avg);
                Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss;
                double Cnmk_ss_err = 0.0;
                if (Cnmk_ss_stdsq > 0) {
                    Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                    Cnmk_ss_err = Cnmk_ss_err / num_pair_ss;
                }
                output_ss1 << scientific << setw(18) << setprecision(8)
                           << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  ";
                double Cnmk_os_avg =
                    (C_nmk_eta12_os[i][j] / total_number_of_events);
                double Cnmk_os_stdsq =
                    (C_nmk_eta12_os_err[i][j] / total_number_of_events
                     - Cnmk_os_avg * Cnmk_os_avg);
                Cnmk_os_avg = Cnmk_os_avg / num_pair_os;
                double Cnmk_os_err = 0.0;
                if (Cnmk_os_stdsq > 0) {
                    Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                    Cnmk_os_err = Cnmk_os_err / num_pair_os;
                }
                output_os1 << scientific << setw(18) << setprecision(8)
                           << Cnmk_os_avg << "  " << Cnmk_os_err << "  ";
                Cnmk_ss_avg = (C_nmk_eta13_ss[i][j] / total_number_of_events);
                Cnmk_ss_stdsq =
                    (C_nmk_eta13_ss_err[i][j] / total_number_of_events
                     - Cnmk_ss_avg * Cnmk_ss_avg);
                Cnmk_ss_avg = Cnmk_ss_avg / num_pair_ss2;
                Cnmk_ss_err = 0.0;
                if (Cnmk_ss_stdsq > 0) {
                    Cnmk_ss_err = sqrt(Cnmk_ss_stdsq / total_number_of_events);
                    Cnmk_ss_err = Cnmk_ss_err / num_pair_ss2;
                }
                output_ss2 << scientific << setw(18) << setprecision(8)
                           << Cnmk_ss_avg << "  " << Cnmk_ss_err << "  ";
                Cnmk_os_avg = (C_nmk_eta13_os[i][j] / total_number_of_events);
                Cnmk_os_stdsq =
                    (C_nmk_eta13_os_err[i][j] / total_number_of_events
                     - Cnmk_os_avg * Cnmk_os_avg);
                Cnmk_os_avg = Cnmk_os_avg / num_pair_os2;
                Cnmk_os_err = 0.0;
                if (Cnmk_os_stdsq > 0) {
                    Cnmk_os_err = sqrt(Cnmk_os_stdsq / total_number_of_events);
                    Cnmk_os_err = Cnmk_os_err / num_pair_os2;
                }
                output_os2 << scientific << setw(18) << setprecision(8)
                           << Cnmk_os_avg << "  " << Cnmk_os_err << "  ";
            }
            output_ss1 << endl;
            output_os1 << endl;
            output_ss2 << endl;
            output_os2 << endl;
        }
        output_ss1.close();
        output_os1.close();
        output_ss2.close();
        output_os2.close();
    }
}